

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeWithIndent(StyledStreamWriter *this,String *value)

{
  String *value_local;
  StyledStreamWriter *this_local;
  
  if (((byte)this->field_0x68 >> 1 & 1) == 0) {
    writeIndent(this);
  }
  std::operator<<(this->document_,(string *)value);
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeWithIndent(const String& value) {
  if (!indented_)
    writeIndent();
  *document_ << value;
  indented_ = false;
}